

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall
QWidgetLineControl::processShortcutOverrideEvent(QWidgetLineControl *this,QKeyEvent *ke)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  socklen_t *in_RCX;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *extraout_RDX_07;
  sockaddr *extraout_RDX_08;
  sockaddr *extraout_RDX_09;
  sockaddr *extraout_RDX_10;
  sockaddr *extraout_RDX_11;
  sockaddr *extraout_RDX_12;
  sockaddr *extraout_RDX_13;
  sockaddr *extraout_RDX_14;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  int iVar4;
  QEvent *in_RSI;
  QWidgetLineControl *in_RDI;
  StandardKey in_stack_ffffffffffffffcc;
  KeyboardModifier in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar4 = 9;
  bVar1 = ::operator==((QKeyEvent *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
  __addr = extraout_RDX;
  if (!bVar1) {
    iVar4 = 0x20;
    bVar1 = ::operator==((QKeyEvent *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
    __addr = extraout_RDX_00;
    if (!bVar1) {
      iVar4 = 0x21;
      bVar1 = ::operator==((QKeyEvent *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc);
      __addr = extraout_RDX_01;
      if (!bVar1) {
        iVar4 = 0x26;
        bVar1 = ::operator==((QKeyEvent *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
        __addr = extraout_RDX_02;
        if (!bVar1) {
          iVar4 = 0x27;
          bVar1 = ::operator==((QKeyEvent *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffcc);
          __addr = extraout_RDX_03;
          if (!bVar1) {
            iVar4 = 0x2a;
            bVar1 = ::operator==((QKeyEvent *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
            __addr = extraout_RDX_04;
            if (!bVar1) {
              iVar4 = 0x2b;
              bVar1 = ::operator==((QKeyEvent *)
                                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                   in_stack_ffffffffffffffcc);
              __addr = extraout_RDX_05;
              if (!bVar1) {
                iVar4 = 0x2e;
                bVar1 = ::operator==((QKeyEvent *)
                                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                     in_stack_ffffffffffffffcc);
                __addr = extraout_RDX_06;
                if (!bVar1) {
                  iVar4 = 0x2f;
                  bVar1 = ::operator==((QKeyEvent *)
                                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                                       ,in_stack_ffffffffffffffcc);
                  __addr = extraout_RDX_07;
                  if (!bVar1) {
                    iVar4 = 0x34;
                    bVar1 = ::operator==((QKeyEvent *)
                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
                    __addr = extraout_RDX_08;
                    if (!bVar1) {
                      iVar4 = 0x35;
                      bVar1 = ::operator==((QKeyEvent *)
                                           CONCAT44(in_stack_ffffffffffffffd4,
                                                    in_stack_ffffffffffffffd0),
                                           in_stack_ffffffffffffffcc);
                      __addr = extraout_RDX_09;
                      if (!bVar1) {
                        iVar4 = 0x36;
                        bVar1 = ::operator==((QKeyEvent *)
                                             CONCAT44(in_stack_ffffffffffffffd4,
                                                      in_stack_ffffffffffffffd0),
                                             in_stack_ffffffffffffffcc);
                        __addr = extraout_RDX_10;
                        if (!bVar1) {
                          iVar4 = 0x37;
                          bVar1 = ::operator==((QKeyEvent *)
                                               CONCAT44(in_stack_ffffffffffffffd4,
                                                        in_stack_ffffffffffffffd0),
                                               in_stack_ffffffffffffffcc);
                          __addr = extraout_RDX_11;
                          if (!bVar1) {
                            iVar4 = 0x38;
                            bVar1 = ::operator==((QKeyEvent *)
                                                 CONCAT44(in_stack_ffffffffffffffd4,
                                                          in_stack_ffffffffffffffd0),
                                                 in_stack_ffffffffffffffcc);
                            __addr = extraout_RDX_12;
                            if (!bVar1) {
                              iVar4 = 0x1a;
                              bVar1 = ::operator==((QKeyEvent *)
                                                   CONCAT44(in_stack_ffffffffffffffd4,
                                                            in_stack_ffffffffffffffd0),
                                                   in_stack_ffffffffffffffcc);
                              __addr = extraout_RDX_13;
                              if (!bVar1) {
                                iVar4 = 0x39;
                                bVar1 = ::operator==((QKeyEvent *)
                                                     CONCAT44(in_stack_ffffffffffffffd4,
                                                              in_stack_ffffffffffffffd0),
                                                     in_stack_ffffffffffffffcc);
                                __addr = extraout_RDX_14;
                                if (!bVar1) {
                                  iVar4 = 10;
                                  bVar1 = ::operator==((QKeyEvent *)
                                                       CONCAT44(in_stack_ffffffffffffffd4,
                                                                in_stack_ffffffffffffffd0),
                                                       in_stack_ffffffffffffffcc);
                                  if (!bVar1) {
                                    iVar4 = 8;
                                    bVar1 = ::operator==((QKeyEvent *)
                                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                                  in_stack_ffffffffffffffd0),
                                                         in_stack_ffffffffffffffcc);
                                    if (!bVar1) {
                                      iVar4 = 0xc;
                                      bVar1 = ::operator==((QKeyEvent *)
                                                           CONCAT44(in_stack_ffffffffffffffd4,
                                                                    in_stack_ffffffffffffffd0),
                                                           in_stack_ffffffffffffffcc);
                                      if (!bVar1) {
                                        iVar4 = 0xb;
                                        bVar1 = ::operator==((QKeyEvent *)
                                                             CONCAT44(in_stack_ffffffffffffffd4,
                                                                      in_stack_ffffffffffffffd0),
                                                             in_stack_ffffffffffffffcc);
                                        if (!bVar1) {
                                          iVar4 = 0x44;
                                          bVar1 = ::operator==((QKeyEvent *)
                                                               CONCAT44(in_stack_ffffffffffffffd4,
                                                                        in_stack_ffffffffffffffd0),
                                                               in_stack_ffffffffffffffcc);
                                          if (!bVar1) {
                                            QKeyEvent::modifiers();
                                            iVar4 = 0;
                                            bVar1 = ::operator==((
                                                  QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                                                  SUB84((ulong)in_RDI >> 0x20,0),
                                                  in_stack_ffffffffffffffd0);
                                            if (!bVar1) {
                                              QKeyEvent::modifiers();
                                              iVar4 = 0x2000000;
                                              bVar1 = ::operator==((
                                                  QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                                                  SUB84((ulong)in_RDI >> 0x20,0),
                                                  in_stack_ffffffffffffffd0);
                                              if (!bVar1) {
                                                QKeyEvent::modifiers();
                                                iVar4 = 0x20000000;
                                                bVar1 = ::operator==((
                                                  QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                                                  SUB84((ulong)in_RDI >> 0x20,0),
                                                  in_stack_ffffffffffffffd0);
                                                if (!bVar1) {
                                                  return;
                                                }
                                              }
                                            }
                                            iVar2 = QKeyEvent::key((QKeyEvent *)in_RSI);
                                            if (iVar2 < 0x1000000) {
                                              bVar1 = isReadOnly(in_RDI);
                                              if (bVar1) {
                                                return;
                                              }
                                              QEvent::accept(in_RSI,iVar4,__addr_01,in_RCX);
                                              return;
                                            }
                                            uVar3 = QKeyEvent::key((QKeyEvent *)in_RSI);
                                            __addr_len = (socklen_t *)(ulong)uVar3;
                                            if ((uVar3 == 0x1000003) || (uVar3 == 0x1000007)) {
                                              bVar1 = isReadOnly(in_RDI);
                                              if (bVar1) {
                                                return;
                                              }
                                              QEvent::accept(in_RSI,iVar4,__addr_03,__addr_len);
                                              return;
                                            }
                                            if ((2 < uVar3 + 0xfefffff0) && (uVar3 != 0x1000014)) {
                                              return;
                                            }
                                            QEvent::accept(in_RSI,iVar4,__addr_02,__addr_len);
                                            return;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  bVar1 = isReadOnly(in_RDI);
                                  if (bVar1) {
                                    return;
                                  }
                                  QEvent::accept(in_RSI,iVar4,__addr_00,in_RCX);
                                  return;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QEvent::accept(in_RSI,iVar4,__addr,in_RCX);
  return;
}

Assistant:

void QWidgetLineControl::processShortcutOverrideEvent(QKeyEvent *ke)
{
    if (ke == QKeySequence::Copy
        || ke == QKeySequence::MoveToNextWord
        || ke == QKeySequence::MoveToPreviousWord
        || ke == QKeySequence::MoveToStartOfLine
        || ke == QKeySequence::MoveToEndOfLine
        || ke == QKeySequence::MoveToStartOfDocument
        || ke == QKeySequence::MoveToEndOfDocument
        || ke == QKeySequence::SelectNextWord
        || ke == QKeySequence::SelectPreviousWord
        || ke == QKeySequence::SelectStartOfLine
        || ke == QKeySequence::SelectEndOfLine
        || ke == QKeySequence::SelectStartOfBlock
        || ke == QKeySequence::SelectEndOfBlock
        || ke == QKeySequence::SelectStartOfDocument
        || ke == QKeySequence::SelectAll
        || ke == QKeySequence::SelectEndOfDocument) {
        ke->accept();
    } else if (ke == QKeySequence::Paste
               || ke == QKeySequence::Cut
               || ke == QKeySequence::Redo
               || ke == QKeySequence::Undo
               || ke == QKeySequence::DeleteCompleteLine) {
        if (!isReadOnly())
            ke->accept();
    } else if (ke->modifiers() == Qt::NoModifier || ke->modifiers() == Qt::ShiftModifier
               || ke->modifiers() == Qt::KeypadModifier) {
        if (ke->key() < Qt::Key_Escape) {
            if (!isReadOnly())
                ke->accept();
        } else {
            switch (ke->key()) {
            case Qt::Key_Delete:
            case Qt::Key_Backspace:
                if (!isReadOnly())
                    ke->accept();
                break;

            case Qt::Key_Home:
            case Qt::Key_End:
            case Qt::Key_Left:
            case Qt::Key_Right:
                ke->accept();
                break;

            default:
                break;
            }
        }
    }
}